

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit
          (RenameLinkedVar *this,SequentialStmtBlock *stmt)

{
  pointer pEVar1;
  Var *pVVar2;
  EventControl *e;
  pointer pEVar3;
  
  pEVar1 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar3 = (stmt->conditions_).
                super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    pVVar2 = match(this,pEVar3->var);
    if (pVVar2 != (Var *)0x0) {
      pEVar3->var = pVVar2;
    }
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
            auto& conds = stmt->get_event_controls();
            for (auto& e : conds) {
                if (auto* v = match(e.var)) {
                    e.var = v;
                }
            }
        }